

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::handleBracketOperator
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TIntermTyped *index)

{
  pointer *pptVar1;
  TSampler TVar2;
  pointer ptVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSampler *sampler;
  TPoolAllocator *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermTyped *base_00;
  undefined4 extraout_var_04;
  TIntermTyped *pTVar6;
  undefined4 extraout_var_05;
  TOperator o;
  TIntermAggregate *unaff_R13;
  TType sampReturnType;
  TIntermConstantUnion *local_d8;
  pointer local_d0;
  TType local_c8;
  
  iVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar5));
  if ((iVar5 != 0xe) ||
     (iVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2a])(base), (char)iVar5 != '\0'))
  goto LAB_00408e9e;
  iVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  sampler = (TSampler *)
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x40))
                      ((long *)CONCAT44(extraout_var_00,iVar5));
  TVar2 = *sampler;
  if (((uint)TVar2 >> 0x13 & 1) == 0) {
    if (((uint)TVar2 >> 0x15 & 1) == 0) {
LAB_00408d28:
      ptVar3 = (this->mipsOperatorMipArg).
               super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
               .
               super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((this->mipsOperatorMipArg).
           super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           .
           super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           ._M_impl.super__Vector_impl_data._M_start == ptVar3) ||
         (ptVar3[-1].mipLevel != (TIntermTyped *)0x0)) {
        this_00 = GetThreadPoolAllocator();
        unaff_R13 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
        o = EOpTextureFetch;
        if ((((uint)*sampler >> 0x13 & 1) != 0) &&
           (o = EOpTextureFetch, (((uint)*sampler & 0xff00) - 0x700 & 0xfffffe00) != 0)) {
          o = EOpImageLoad;
        }
        TIntermAggregate::TIntermAggregate(unaff_R13,o);
        TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
        getTextureReturnType(this,sampler,&local_c8);
        (*(unaff_R13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(unaff_R13,&local_c8);
        (*(unaff_R13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [1])(unaff_R13,loc);
        iVar5 = (*(unaff_R13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(unaff_R13);
        local_d8 = (TIntermConstantUnion *)base;
        std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                  ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   CONCAT44(extraout_var_01,iVar5),(TIntermNode **)&local_d8);
        iVar5 = (*(unaff_R13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(unaff_R13);
        local_d8 = (TIntermConstantUnion *)index;
        std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                  ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   CONCAT44(extraout_var_02,iVar5),(TIntermNode **)&local_d8);
        if ((sampler->field_0x2 & 0x28) == 0) {
          local_d0 = (this->mipsOperatorMipArg).
                     super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                     .
                     super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ptVar3 = (this->mipsOperatorMipArg).
                   super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   .
                   super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          iVar5 = (*(unaff_R13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(unaff_R13);
          if (local_d0 == ptVar3) {
            local_d8 = TIntermediate::addConstantUnion
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                  0,loc,true);
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_03,iVar5),(TIntermNode **)&local_d8);
          }
          else {
            local_d8 = (TIntermConstantUnion *)
                       (this->mipsOperatorMipArg).
                       super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       .
                       super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].mipLevel;
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_03,iVar5),(TIntermNode **)&local_d8);
            pptVar1 = &(this->mipsOperatorMipArg).
                       super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       .
                       super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + -1;
          }
        }
        bVar4 = false;
      }
      else {
        ptVar3[-1].mipLevel = index;
        bVar4 = false;
        unaff_R13 = (TIntermAggregate *)base;
      }
    }
    else {
LAB_00408e65:
      bVar4 = true;
    }
  }
  else {
    bVar4 = true;
    if (((uint)TVar2 & 0xff00) == 0x700) goto LAB_00408e65;
    if (((uint)TVar2 & 0xff00) != 0x800) goto LAB_00408d28;
  }
  if (!bVar4) {
    return (TIntermTyped *)unaff_R13;
  }
LAB_00408e9e:
  base_00 = indexStructBufferContent(this,loc,base);
  if (base_00 == (TIntermTyped *)0x0) {
    pTVar6 = (TIntermTyped *)0x0;
  }
  else {
    iVar5 = (*(index->super_TIntermNode)._vptr_TIntermNode[0x21])(index);
    pTVar6 = TIntermediate::addIndex
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        ((*(uint *)(CONCAT44(extraout_var_04,iVar5) + 8) & 0x7f) != 2) +
                        EOpIndexDirect,base_00,index,loc);
    iVar5 = (*(base_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(base_00);
    TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_05,iVar5),0,false);
    (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar6,&local_c8);
  }
  return pTVar6;
}

Assistant:

TIntermTyped* HlslParseContext::handleBracketOperator(const TSourceLoc& loc, TIntermTyped* base, TIntermTyped* index)
{
    // handle r-value operator[] on textures and images.  l-values will be processed later.
    if (base->getType().getBasicType() == EbtSampler && !base->isArray()) {
        const TSampler& sampler = base->getType().getSampler();
        if (sampler.isImage() || sampler.isTexture()) {
            if (! mipsOperatorMipArg.empty() && mipsOperatorMipArg.back().mipLevel == nullptr) {
                // The first operator[] to a .mips[] sequence is the mip level.  We'll remember it.
                mipsOperatorMipArg.back().mipLevel = index;
                return base;  // next [] index is to the same base.
            } else {
                TIntermAggregate* load = new TIntermAggregate(sampler.isImage() ? EOpImageLoad : EOpTextureFetch);

                TType sampReturnType;
                getTextureReturnType(sampler, sampReturnType);

                load->setType(sampReturnType);
                load->setLoc(loc);
                load->getSequence().push_back(base);
                load->getSequence().push_back(index);

                // Textures need a MIP.  If we saw one go by, use it.  Otherwise, use zero.
                if (sampler.isTexture()) {
                    if (! mipsOperatorMipArg.empty()) {
                        load->getSequence().push_back(mipsOperatorMipArg.back().mipLevel);
                        mipsOperatorMipArg.pop_back();
                    } else {
                        load->getSequence().push_back(intermediate.addConstantUnion(0, loc, true));
                    }
                }

                return load;
            }
        }
    }

    // Handle operator[] on structured buffers: this indexes into the array element of the buffer.
    // indexStructBufferContent returns nullptr if it isn't a structuredbuffer (SSBO).
    TIntermTyped* sbArray = indexStructBufferContent(loc, base);
    if (sbArray != nullptr) {
        // Now we'll apply the [] index to that array
        const TOperator idxOp = (index->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;

        TIntermTyped* element = intermediate.addIndex(idxOp, sbArray, index, loc);
        const TType derefType(sbArray->getType(), 0);
        element->setType(derefType);
        return element;
    }

    return nullptr;
}